

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::PrintAny
          (Printer *this,Message *message,TextGenerator *generator)

{
  bool bVar1;
  int iVar2;
  Descriptor *pDVar3;
  Reflection *this_00;
  undefined4 extraout_var;
  FastFieldValuePrinter *pFVar4;
  long *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  FastFieldValuePrinter *printer;
  string serialized_value;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
  value_message;
  DynamicMessageFactory factory;
  Descriptor *value_descriptor;
  string full_type_name;
  string url_prefix;
  string *type_url;
  Reflection *reflection;
  FieldDescriptor *value_field;
  FieldDescriptor *type_url_field;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  LogMessage *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  LogMessage *in_stack_fffffffffffffdd0;
  FieldDescriptor *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  undefined1 uVar5;
  Message *in_stack_fffffffffffffde8;
  Reflection *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  string local_168 [72];
  TextGenerator *in_stack_fffffffffffffee0;
  Message *in_stack_fffffffffffffee8;
  Printer *in_stack_fffffffffffffef0;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string *local_40;
  Reflection *local_38;
  long *local_20;
  undefined8 local_18;
  byte local_1;
  Message *message_00;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = internal::GetAnyFieldDescriptors
                    ((Message *)in_stack_fffffffffffffdd8,
                     (FieldDescriptor **)in_stack_fffffffffffffdd0,
                     (FieldDescriptor **)in_stack_fffffffffffffdc8);
  if (bVar1) {
    local_38 = Message::GetReflection((Message *)in_stack_fffffffffffffdc0);
    Reflection::GetString_abi_cxx11_
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (FieldDescriptor *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    local_40 = local_60;
    std::__cxx11::string::string(local_80);
    std::__cxx11::string::string(local_a0);
    bVar1 = internal::ParseAnyTypeUrl
                      (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08
                      );
    if (bVar1) {
      if (*(long *)(in_RDI + 0x80) == 0) {
        pDVar3 = anon_unknown_19::DefaultFinderFindAnyType
                           ((Message *)in_stack_fffffffffffffdc8,(string *)in_stack_fffffffffffffdc0
                            ,(string *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)
                           );
      }
      else {
        pDVar3 = (Descriptor *)
                 (**(code **)(**(long **)(in_RDI + 0x80) + 0x20))
                           (*(long **)(in_RDI + 0x80),local_18,local_80,local_a0);
      }
      if (pDVar3 == (Descriptor *)0x0) {
        internal::LogMessage::LogMessage
                  (in_stack_fffffffffffffdd0,
                   (LogLevel_conflict)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                   (char *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffdc0,
                   (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffdc0,
                   (string *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffdc0,
                   (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        internal::LogFinisher::operator=
                  ((LogFinisher *)in_stack_fffffffffffffdc0,
                   (LogMessage *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        internal::LogMessage::~LogMessage((LogMessage *)0x45000f);
        local_1 = 0;
      }
      else {
        DynamicMessageFactory::DynamicMessageFactory
                  ((DynamicMessageFactory *)
                   CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
        this_00 = (Reflection *)
                  DynamicMessageFactory::GetPrototype
                            ((DynamicMessageFactory *)
                             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                             (Descriptor *)in_stack_fffffffffffffdd8);
        iVar2 = (*((MessageLite *)&this_00->descriptor_)->_vptr_MessageLite[3])();
        message_00 = (Message *)CONCAT44(extraout_var,iVar2);
        std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
        unique_ptr<std::default_delete<google::protobuf::Message>,void>
                  ((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                    *)in_stack_fffffffffffffdc0,
                   (pointer)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        Reflection::GetString_abi_cxx11_
                  (this_00,message_00,
                   (FieldDescriptor *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0))
        ;
        std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
        ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                      *)0x4500d3);
        bVar1 = MessageLite::ParseFromString
                          ((MessageLite *)in_stack_fffffffffffffdc0,
                           (string *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        if (bVar1) {
          uVar5 = bVar1;
          BaseTextGenerator::PrintLiteral<2ul>
                    ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                     (char (*) [2])CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          BaseTextGenerator::PrintString
                    ((BaseTextGenerator *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          BaseTextGenerator::PrintLiteral<2ul>
                    ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                     (char (*) [2])CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          pFVar4 = GetFieldPrinter((Printer *)CONCAT17(uVar5,in_stack_fffffffffffffde0),
                                   in_stack_fffffffffffffdd8);
          (*pFVar4->_vptr_FastFieldValuePrinter[0xe])
                    (pFVar4,local_18,0xffffffff,0,(ulong)(*(byte *)(in_RDI + 4) & 1),local_20);
          (**(code **)(*local_20 + 0x10))();
          in_stack_fffffffffffffdc0 =
               (LogMessage *)
               std::
               unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               ::operator*((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                            *)in_stack_fffffffffffffdc0);
          Print(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
          (**(code **)(*local_20 + 0x18))();
          (*pFVar4->_vptr_FastFieldValuePrinter[0xf])
                    (pFVar4,local_18,0xffffffff,0,(ulong)(*(byte *)(in_RDI + 4) & 1),local_20);
        }
        else {
          internal::LogMessage::LogMessage
                    (in_stack_fffffffffffffdd0,
                     (LogLevel_conflict)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                     (char *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
          internal::LogMessage::operator<<
                    (in_stack_fffffffffffffdc0,
                     (string *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          internal::LogMessage::operator<<
                    (in_stack_fffffffffffffdc0,
                     (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          internal::LogFinisher::operator=
                    ((LogFinisher *)in_stack_fffffffffffffdc0,
                     (LogMessage *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          internal::LogMessage::~LogMessage((LogMessage *)0x45016c);
        }
        local_1 = bVar1;
        std::__cxx11::string::~string(local_168);
        std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
        ::~unique_ptr((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                       *)in_stack_fffffffffffffdc0);
        DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)this_00);
      }
    }
    else {
      local_1 = 0;
    }
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_60);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool TextFormat::Printer::PrintAny(const Message& message,
                                   TextGenerator* generator) const {
  const FieldDescriptor* type_url_field;
  const FieldDescriptor* value_field;
  if (!internal::GetAnyFieldDescriptors(message, &type_url_field,
                                        &value_field)) {
    return false;
  }

  const Reflection* reflection = message.GetReflection();

  // Extract the full type name from the type_url field.
  const std::string& type_url = reflection->GetString(message, type_url_field);
  std::string url_prefix;
  std::string full_type_name;
  if (!internal::ParseAnyTypeUrl(type_url, &url_prefix, &full_type_name)) {
    return false;
  }

  // Print the "value" in text.
  const Descriptor* value_descriptor =
      finder_ ? finder_->FindAnyType(message, url_prefix, full_type_name)
              : DefaultFinderFindAnyType(message, url_prefix, full_type_name);
  if (value_descriptor == nullptr) {
    GOOGLE_LOG(WARNING) << "Proto type " << type_url << " not found";
    return false;
  }
  DynamicMessageFactory factory;
  std::unique_ptr<Message> value_message(
      factory.GetPrototype(value_descriptor)->New());
  std::string serialized_value = reflection->GetString(message, value_field);
  if (!value_message->ParseFromString(serialized_value)) {
    GOOGLE_LOG(WARNING) << type_url << ": failed to parse contents";
    return false;
  }
  generator->PrintLiteral("[");
  generator->PrintString(type_url);
  generator->PrintLiteral("]");
  const FastFieldValuePrinter* printer = GetFieldPrinter(value_field);
  printer->PrintMessageStart(message, -1, 0, single_line_mode_, generator);
  generator->Indent();
  Print(*value_message, generator);
  generator->Outdent();
  printer->PrintMessageEnd(message, -1, 0, single_line_mode_, generator);
  return true;
}